

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O2

void Saig_MvSimulateFrame(Saig_MvMan_t *p,int fFirst,int fVerbose)

{
  Saig_MvObj_t *pAig;
  uint uVar1;
  uint uVar2;
  int iVar3;
  Saig_MvObj_t *pSVar4;
  uint uVar5;
  Saig_MvAnd_t *pSVar6;
  int iVar7;
  uint uVar8;
  Saig_MvAnd_t *pSVar9;
  
  pSVar4 = p->pAigOld;
  do {
    uVar5 = *(uint *)&pSVar4->field_0x8 & 7;
    switch(uVar5) {
    case 0:
      goto switchD_00575774_caseD_0;
    case 1:
      break;
    case 2:
      if (pSVar4->iFan1 == 0) {
        uVar5 = 0xfffffff2;
        if (fFirst != 0) {
          iVar7 = Saig_MvCreateObj(p,0,0);
          uVar5 = *(uint *)&pSVar4->field_0x8 & 7 | iVar7 << 4;
        }
        break;
      }
      goto switchD_00575774_caseD_0;
    case 3:
      iVar7 = Saig_MvSimulateValue0(p->pAigOld,pSVar4);
      uVar5 = iVar7 * 8 + 3;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigSimMv.c"
                    ,0x1d0,"void Saig_MvSimulateFrame(Saig_MvMan_t *, int, int)");
    case 5:
      pAig = p->pAigOld;
      uVar1 = Saig_MvSimulateValue0(pAig,pSVar4);
      uVar2 = *(uint *)&pAig[pSVar4->iFan1 >> 1].field_0x8 >> 3;
      uVar5 = pSVar4->iFan1 & 1U ^ uVar2;
      if (uVar2 == 0x1ffffffe) {
        uVar5 = 0x1ffffffe;
      }
      uVar2 = uVar1;
      if ((uVar1 != uVar5) && (uVar2 = 1, (uVar5 ^ uVar1) != 1)) {
        if (uVar1 < 2) {
          uVar2 = uVar5;
          if (uVar1 != 0) {
            uVar2 = 1;
          }
        }
        else if (uVar5 < 2) {
          uVar2 = uVar1;
          if (uVar5 != 0) {
            uVar2 = 1;
          }
        }
        else {
          uVar2 = 0x1ffffffe;
          if ((uVar1 != 0x1ffffffe && fFirst != 0) && uVar5 != 0x1ffffffe) {
            uVar2 = uVar5;
            if (uVar1 >= uVar5 && uVar1 != uVar5) {
              uVar2 = uVar1;
            }
            if (uVar1 < uVar5) {
              uVar5 = uVar1;
            }
            if (uVar2 <= uVar5) {
              __assert_fail("iFan0 < iFan1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigSimMv.c"
                            ,0x11d,"int Saig_MvHash(int, int, int)");
            }
            uVar1 = 0;
            if ((uVar5 & 1) != 0) {
              uVar1 = 0x38f;
            }
            uVar8 = 0;
            if ((uVar2 & 1) != 0) {
              uVar8 = 0x161;
            }
            pSVar9 = (Saig_MvAnd_t *)
                     (p->pTNodes +
                     (ulong)(uVar1 ^ (uVar5 >> 1) * 0x1f01 ^ (uVar2 >> 1) * 0xb9b ^ uVar8) %
                     (ulong)(uint)p->nTNodesSize);
            iVar7 = pSVar9->iFan0;
            if (iVar7 != 0) goto LAB_005758f1;
            pSVar6 = (Saig_MvAnd_t *)0x0;
            while ((pSVar6 != (Saig_MvAnd_t *)0x0 &&
                   ((pSVar6->iFan0 != uVar5 || (pSVar6->iFan1 != uVar2))))) {
              iVar7 = pSVar6->iNext;
              pSVar9 = (Saig_MvAnd_t *)&pSVar6->iNext;
              pSVar6 = (Saig_MvAnd_t *)0x0;
              if (iVar7 != 0) {
LAB_005758f1:
                pSVar6 = p->pAigNew + iVar7;
              }
            }
            if (iVar7 == 0) {
              pSVar6 = p->pAigNew;
              if ((pSVar9 < pSVar6) || (pSVar6 + p->nObjsAlloc <= pSVar9)) {
                iVar7 = Saig_MvCreateObj(p,uVar5,uVar2);
                pSVar9->iFan0 = iVar7;
              }
              else {
                iVar7 = Saig_MvCreateObj(p,uVar5,uVar2);
                (&p->pAigNew->iFan0)[(int)((ulong)((long)pSVar9 - (long)pSVar6) >> 2)] = iVar7;
              }
            }
            uVar2 = iVar7 * 2;
          }
        }
      }
      uVar5 = (*(uint *)&pSVar4->field_0x8 & 7) + uVar2 * 8;
      break;
    case 7:
      for (iVar7 = 0; iVar7 < p->vFlops->nSize; iVar7 = iVar7 + 1) {
        pSVar4 = (Saig_MvObj_t *)Vec_PtrEntry(p->vFlops,iVar7);
        iVar3 = Saig_MvSimulateValue0(p->pAigOld,pSVar4);
        *(uint *)&pSVar4->field_0x8 = (*(uint *)&pSVar4->field_0x8 & 7) + iVar3 * 8;
      }
      return;
    }
    *(uint *)&pSVar4->field_0x8 = uVar5;
switchD_00575774_caseD_0:
    pSVar4 = pSVar4 + 1;
  } while( true );
}

Assistant:

void Saig_MvSimulateFrame( Saig_MvMan_t * p, int fFirst, int fVerbose )
{
    Saig_MvObj_t * pEntry;
    int i;
    Saig_MvManForEachObj( p->pAigOld, pEntry )
    {
        if ( pEntry->Type == AIG_OBJ_AND )
        {
            pEntry->Value = Saig_MvAnd( p, 
                Saig_MvSimulateValue0(p->pAigOld, pEntry),
                Saig_MvSimulateValue1(p->pAigOld, pEntry), fFirst );
        }
        else if ( pEntry->Type == AIG_OBJ_CO )
            pEntry->Value = Saig_MvSimulateValue0(p->pAigOld, pEntry);
        else if ( pEntry->Type == AIG_OBJ_CI )
        {
            if ( pEntry->iFan1 == 0 ) // true PI
            {
                if ( fFirst )
                    pEntry->Value = Saig_MvVar2Lit( Saig_MvCreateObj( p, 0, 0 ) );
                else
                    pEntry->Value = SAIG_UNDEF_VALUE;
            }
//            else if ( fFirst ) // register output
//                pEntry->Value = Saig_MvConst0();
//            else
//                pEntry->Value = Saig_MvSimulateValue0(p->pAigOld, pEntry);
        }
        else if ( pEntry->Type == AIG_OBJ_CONST1 )
            pEntry->Value = Saig_MvConst1();
        else if ( pEntry->Type != AIG_OBJ_NONE )
            assert( 0 );
    }
    // transfer to registers
    Vec_PtrForEachEntry( Saig_MvObj_t *, p->vFlops, pEntry, i )
        pEntry->Value = Saig_MvSimulateValue0( p->pAigOld, pEntry );
}